

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QAM *q)

{
  pointer pcVar1;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [24];
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_40;
  
  local_78._0_4_ = (q->qam)._M_elems[0];
  local_78._4_4_ = (q->qam)._M_elems[1];
  local_78._8_4_ = (q->qam)._M_elems[2];
  local_78._12_4_ = (q->qam)._M_elems[3];
  pcVar1 = (q->tag)._M_dataplus._M_p;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (q->tag)._M_string_length);
  GenerateQuartetTargets((QuartetSet *)&local_40,(QAM *)local_78);
  Create(this,(QuartetSet *)&local_40);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_40);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(QAM q)
{
    Create(GenerateQuartetTargets(q));
}